

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O3

void __thiscall
ON_ClassArray<ON_UserString>::Append(ON_ClassArray<ON_UserString> *this,int count,ON_UserString *p)

{
  uint uVar1;
  int iVar2;
  ON_UserString *pOVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  
  if (p != (ON_UserString *)0x0 && 0 < count) {
    uVar1 = this->m_count;
    uVar4 = uVar1 + count;
    if (this->m_capacity < (int)uVar4) {
      if ((int)uVar1 < 8 || (ulong)((long)(int)uVar1 << 4) < 0x10000001) {
        uVar5 = 4;
        if (2 < (int)uVar1) {
          uVar5 = uVar1 * 2;
        }
      }
      else {
        uVar5 = 0x1000008;
        if (uVar1 < 0x1000008) {
          uVar5 = uVar1;
        }
        uVar5 = uVar5 + uVar1;
      }
      if ((int)uVar4 < (int)uVar5) {
        uVar4 = uVar5;
      }
      if ((uint)this->m_capacity < uVar4) {
        SetCapacity(this,(long)(int)uVar4);
      }
    }
    uVar6 = (ulong)(uint)count;
    do {
      pOVar3 = this->m_a;
      iVar2 = this->m_count;
      this->m_count = iVar2 + 1;
      ON_wString::operator=(&pOVar3[iVar2].m_key,&p->m_key);
      ON_wString::operator=(&pOVar3[iVar2].m_string_value,&p->m_string_value);
      p = p + 1;
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
  }
  return;
}

Assistant:

void ON_ClassArray<T>::Append( int count, const T* p ) 
{
  int i;
  if ( count > 0 && p ) 
  {
    if ( count + m_count > m_capacity ) 
    {
      int newcapacity = NewCapacity();
      if ( newcapacity < count + m_count )
        newcapacity = count + m_count;
      Reserve( newcapacity );
    }
    for ( i = 0; i < count; i++ ) {
      m_a[m_count++] = p[i];
    }
  }
}